

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  Mutex *this;
  LogDestination *pLVar1;
  int line;
  CheckOpString local_38;
  LogMessageFatal local_30;
  
  local_38.str_ = Check_GEImpl_abi_cxx11_(severity,0,"severity >= 0");
  if (local_38.str_ == (string *)0x0) {
    local_38.str_ = Check_LTImpl_abi_cxx11_(severity,4,"severity < NUM_SEVERITIES");
    if (local_38.str_ == (string *)0x0) {
      ::glog_internal_namespace_::Mutex::Lock((Mutex *)log_mutex);
      pLVar1 = log_destination(severity);
      this = &(pLVar1->fileobject_).lock_;
      ::glog_internal_namespace_::Mutex::Lock(this);
      std::__cxx11::string::assign((char *)&(pLVar1->fileobject_).symlink_basename_);
      ::glog_internal_namespace_::Mutex::Unlock(this);
      ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
      return;
    }
    line = 0x263;
  }
  else {
    line = 0x262;
  }
  LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc",
             line,&local_38);
  LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}